

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pIVar2;
  int x;
  ostream *poVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  Image *this;
  vector<Image,_std::allocator<Image>_> pymask_images;
  ofstream out;
  int aiStack_2d8 [120];
  char padding [192];
  
  if (argc < 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," pymask.pic cgamask.pic\n");
    std::operator<<((ostream *)&std::cerr,
                    "Converts pymask.pic from EGA to CGA and stores it in to cgamask.pic\n");
    iVar6 = 1;
  }
  else {
    pcVar1 = argv[2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out,argv[1],(allocator<char> *)padding);
    LoadEgaSpritesheet(&pymask_images,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::ofstream::ofstream(&out,pcVar1,_S_bin);
    if (*(int *)((long)aiStack_2d8 + *(long *)(_out + -0x18)) == 0) {
      uVar4 = 0;
      while( true ) {
        pIVar2 = pymask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = 0;
        if ((ulong)((long)pymask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pymask_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) <= uVar4) break;
        cVar5 = (char)&out;
        std::ostream::put(cVar5);
        std::ostream::put(cVar5);
        std::ostream::put(cVar5);
        std::ostream::put(cVar5);
        this = pIVar2 + uVar4;
        for (iVar6 = 0; iVar6 < this->height_; iVar6 = iVar6 + 1) {
          for (x = 3; x + -3 < this->width_; x = x + 4) {
            Image::Get(this,x + -3,iVar6);
            Image::Get(this,x + -2,iVar6);
            Image::Get(this,x + -1,iVar6);
            if (this->width_ != x) {
              Image::Get(this,x,iVar6);
            }
            std::ostream::put((char)&out);
          }
        }
        std::ostream::write((char *)&out,(long)padding);
        uVar4 = uVar4 + 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open: ");
      poVar3 = std::operator<<(poVar3,pcVar1);
      std::operator<<(poVar3,"\n");
      iVar6 = 1;
    }
    std::ofstream::~ofstream(&out);
    std::vector<Image,_std::allocator<Image>_>::~vector(&pymask_images);
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 3) {
    std::cerr << "Usage: " << argv[0] << " pymask.pic cgamask.pic\n";
    std::cerr << "Converts pymask.pic from EGA to CGA and stores it in to "
                 "cgamask.pic\n";
    return 1;
  }

  auto const pymask_filename = argv[1];
  auto const cgamask_filename = argv[2];

  auto const pymask_images = LoadEgaSpritesheet(pymask_filename);

  std::ofstream out(cgamask_filename, std::ios_base::binary);
  if (!out.good()) {
    std::cerr << "Couldn't open: " << cgamask_filename << "\n";
    return 1;
  }

  for (auto i = 0; i < pymask_images.size(); ++i) {
    auto const& img = pymask_images[i];

    // First, write "CGA header". If this is missing then the data will be
    // ignored.
    out.put(0x0E);
    out.put(0x00);
    out.put(0x0E);
    out.put(0x00);

    // Then Dump image (fit width=15 into cell of size 16)
    for (auto y = 0; y < img.GetHeight(); ++y) {
      for (auto x = 0; x < img.GetWidth(); x += 4) {
        // TODO more generic function that handles incomplete rows
        auto c = (img.Get(x, y) == color_white ? 0b11000000 : 0) |
                 (img.Get(x + 1, y) == color_white ? 0b00110000 : 0) |
                 (img.Get(x + 2, y) == color_white ? 0b00001100 : 0);

        // Non-full row (can happen because image data is 15x15)
        if (img.GetWidth() - x != 3) {
          c |= img.Get(x + 3, y) == color_white ? 0b00000011 : 0;
        }

        out.put(c);
      }
    }

    // finally Write 192 bytes of garbage
    char padding[192];
    out.write(padding, sizeof(padding));
  }

  return 0;
}